

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reassembly.c
# Opt level: O1

int la_reasm_payload_get(la_reasm_table *rtable,void *msg_info,uint8_t **result)

{
  void *pvVar1;
  void *key;
  void *pvVar2;
  uint8_t *puVar3;
  la_list *l;
  int iVar4;
  uint8_t *__dest;
  
  key = (*(rtable->funcs).get_tmp_key)(msg_info);
  pvVar2 = la_hash_lookup(rtable->fragment_table,key);
  if (pvVar2 == (void *)0x0) {
    iVar4 = -1;
  }
  else if ((int)*(uint *)((long)pvVar2 + 4) < 1) {
    iVar4 = 0;
  }
  else {
    puVar3 = (uint8_t *)
             la_xcalloc((ulong)*(uint *)((long)pvVar2 + 4) + 1,1,
                        "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/reassembly.c"
                        ,0x1d1,"la_reasm_payload_get");
    __dest = puVar3;
    for (l = *(la_list **)((long)pvVar2 + 0x38); l != (la_list *)0x0; l = la_list_next(l)) {
      pvVar1 = l->data;
      if ((*(void **)((long)pvVar1 + 8) != (void *)0x0) && (*(size_t *)((long)pvVar1 + 0x10) != 0))
      {
        memcpy(__dest,*(void **)((long)pvVar1 + 8),*(size_t *)((long)pvVar1 + 0x10));
      }
      __dest = __dest + *(long *)((long)pvVar1 + 0x10);
    }
    puVar3[*(int *)((long)pvVar2 + 4)] = '\0';
    *result = puVar3;
    iVar4 = *(int *)((long)pvVar2 + 4);
    la_hash_remove(rtable->fragment_table,key);
  }
  free(key);
  return iVar4;
}

Assistant:

int la_reasm_payload_get(la_reasm_table *rtable, void const *msg_info, uint8_t **result) {
	la_assert(rtable != NULL);
	la_assert(msg_info != NULL);
	la_assert(result != NULL);

	void *tmp_key = rtable->funcs.get_tmp_key(msg_info);
	la_assert(tmp_key);

	size_t result_len = -1;
	la_reasm_table_entry *rt_entry = la_hash_lookup(rtable->fragment_table, tmp_key);
	if(rt_entry == NULL) {
		result_len = -1;
		goto end;
	}
	if(rt_entry->frags_collected_total_len < 1) {
		result_len = 0;
		goto end;
	}
	// Append a NULL byte at the end of the reassembled buffer, so that it can be
	// cast to char * if this is a text message.
	uint8_t *reasm_buf = LA_XCALLOC(rt_entry->frags_collected_total_len + 1, sizeof(uint8_t));
	uint8_t *ptr = reasm_buf;
	for(la_list *l = rt_entry->fragment_list; l != NULL; l = la_list_next(l)) {
		la_reasm_fragment *fragment = l->data;
		if(fragment->payload.buf != NULL && fragment->payload.len > 0) {
			memcpy(ptr, fragment->payload.buf, fragment->payload.len);
		}
		ptr += fragment->payload.len;
	}
	reasm_buf[rt_entry->frags_collected_total_len] = '\0'; // buffer len is frags_collected_total_len + 1
	*result = reasm_buf;
	result_len = rt_entry->frags_collected_total_len;
	la_hash_remove(rtable->fragment_table, tmp_key);
end:
	LA_XFREE(tmp_key);
	return result_len;
}